

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O2

void irr::video::CColorConverter::convert16bitToA8R8G8B8andResize
               (s16 *in,s32 *out,s32 newWidth,s32 newHeight,s32 currentWidth,s32 currentHeight)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  float fVar8;
  
  if (newHeight != 0 && newWidth != 0) {
    uVar4 = 0;
    uVar1 = (ulong)(uint)newHeight;
    if (newHeight < 1) {
      uVar1 = uVar4;
    }
    uVar2 = (ulong)(uint)newWidth;
    if (newWidth < 1) {
      uVar2 = 0;
    }
    for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      fVar8 = 0.0;
      piVar5 = out;
      uVar6 = uVar1;
      while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
        uVar3 = (uint)in[(int)((float)((int)fVar8 * currentWidth) +
                              (float)(int)uVar4 * ((float)currentWidth / (float)newWidth))];
        *piVar5 = ((uVar3 & 0x3e0) << 6 | (uVar3 & 0x7c00) << 9 | uVar3 & 0x80000000) +
                  (uVar3 & 0x1f) * 8;
        fVar8 = fVar8 + (float)currentHeight / (float)newHeight;
        piVar5 = piVar5 + newWidth;
      }
      out = out + 1;
    }
  }
  return;
}

Assistant:

void CColorConverter::convert16bitToA8R8G8B8andResize(const s16 *in, s32 *out, s32 newWidth, s32 newHeight, s32 currentWidth, s32 currentHeight)
{
	if (!newWidth || !newHeight)
		return;

	// note: this is very very slow. (i didn't want to write a fast version.
	// but hopefully, nobody wants to convert surfaces every frame.

	f32 sourceXStep = (f32)currentWidth / (f32)newWidth;
	f32 sourceYStep = (f32)currentHeight / (f32)newHeight;
	f32 sy;
	s32 t;

	for (s32 x = 0; x < newWidth; ++x) {
		sy = 0.0f;

		for (s32 y = 0; y < newHeight; ++y) {
			t = in[(s32)(((s32)sy) * currentWidth + x * sourceXStep)];
			t = (((t >> 15) & 0x1) << 31) | (((t >> 10) & 0x1F) << 19) |
				(((t >> 5) & 0x1F) << 11) | (t & 0x1F) << 3;
			out[(s32)(y * newWidth + x)] = t;

			sy += sourceYStep;
		}
	}
}